

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O2

void __thiscall
vkt::
InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>::Args,_vkt::FunctionPrograms1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>_>
::initPrograms(InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>::Args,_vkt::FunctionPrograms1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>_>
               *this,SourceCollections *dst)

{
  Function p_Var1;
  Parameters in_stack_ffffffffffffffb8;
  
  p_Var1 = (this->m_progs).m_func;
  api::anon_unknown_1::ShaderModule::Parameters::Parameters
            ((Parameters *)&stack0xffffffffffffffc0,&(this->m_arg0).arg0);
  (*p_Var1)(dst,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void			initPrograms		(vk::SourceCollections& dst) const { m_progs.init(dst, m_arg0); }